

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_set_var_test(btree_kv_ops *kv_ops)

{
  uint __line;
  int iVar1;
  size_t sVar2;
  bnode *__ptr;
  char *pcVar3;
  void *__s1;
  ulong __n;
  char key [4];
  uint64_t value;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(key,"key",4);
  value = 10;
  sVar2 = strlen(key);
  __ptr = dummy_node((uint8_t)sVar2,'\b',1);
  (*kv_ops->set_kv)(__ptr,0,key,&value);
  __s1 = (__ptr->field_4).data;
  __n = sVar2 & 0xff;
  iVar1 = bcmp(__s1,key,__n);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x73);
    kv_set_var_test(btree_kv_ops*)::__test_pass = '\x01';
    __s1 = (__ptr->field_4).data;
    iVar1 = bcmp(__s1,key,__n);
    if (iVar1 != 0) {
      pcVar3 = "!(memcmp(node->data, key, ksize))";
      __line = 0x73;
      goto LAB_00101746;
    }
  }
  if (*(uint64_t *)((long)__s1 + __n) != value) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x74);
    kv_set_var_test(btree_kv_ops*)::__test_pass = '\x01';
    if (*(uint64_t *)((long)(__ptr->field_4).data + __n) != value) {
      pcVar3 = "!(memcmp((uint8_t*)node->data + ksize, &value, vsize))";
      __line = 0x74;
LAB_00101746:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,__line,"void kv_set_var_test(btree_kv_ops *)");
    }
  }
  free(__ptr);
  memleak_end();
  pcVar3 = "%s PASSED\n";
  if (kv_set_var_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar3 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar3,"kv set var test");
  return;
}

Assistant:

void kv_set_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t ksize, vsize;
    int level;
    idx_t idx;
    char key[] = "key";
    uint64_t value = 10;

    ksize = strlen(key);
    vsize = sizeof(value);

    // set key/value in node
    idx = 0;
    level = 1;
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, (void*)key, (void*)&value);

    // verify node->data
    TEST_CHK(!(memcmp(node->data, key, ksize)));
    TEST_CHK(!(memcmp((uint8_t*)node->data + ksize, &value, vsize)));

    free(node);

    memleak_end();
    TEST_RESULT("kv set var test");
}